

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astFunctionApplicationNode_primitiveCompileIntoBytecode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  long lVar1;
  _Bool _Var2;
  _Bool _Var3;
  sysbvm_tuple_t sVar4;
  sysbvm_tuple_t sVar5;
  size_t sVar6;
  sysbvm_tuple_t *psVar7;
  sysbvm_bitflags_t sVar8;
  ulong uVar9;
  size_t i;
  sysbvm_tuple_t sVar10;
  sysbvm_tuple_t local_a8;
  sysbvm_tuple_t sStack_a0;
  sysbvm_tuple_t local_98;
  sysbvm_tuple_t sStack_90;
  sysbvm_tuple_t local_88;
  sysbvm_tuple_t sStack_80;
  sysbvm_tuple_t local_78;
  sysbvm_tuple_t sStack_70;
  sysbvm_tuple_t local_68;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  undefined1 *local_40;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_78 = 0;
  sStack_70 = 0;
  local_88 = 0;
  sStack_80 = 0;
  local_98 = 0;
  sStack_90 = 0;
  local_a8 = 0;
  sStack_a0 = 0;
  local_68 = 0;
  local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_58._12_4_ = 0;
  local_48 = 9;
  local_40 = (undefined1 *)&local_a8;
  sysbvm_stackFrame_pushRecord(&local_58);
  uVar9 = *(ulong *)(*arguments + 0x30);
  if ((uVar9 & 0xf) == 0 && uVar9 != 0) {
    sVar10 = (sysbvm_tuple_t)(*(uint *)(uVar9 + 0xc) >> 3);
  }
  else {
    sVar10 = 0;
  }
  sVar4 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                    (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
                     *(sysbvm_tuple_t *)(*arguments + 0x28));
  lVar1 = *(long *)(arguments[1] + 0x10);
  local_a8 = sVar4;
  sVar5 = sysbvm_tuple_getType(context,sVar4);
  if ((sVar5 == (context->roots).functionBytecodeAssemblerVectorOperand) &&
     ((*(ulong *)(sVar4 + 0x10) & 0x80000) == 0 &&
      ((uint)*(undefined8 *)(sVar4 + 0x18) & 0xffff0) == 0x20)) {
    uVar9 = (ulong)((uint)*(ulong *)(sVar4 + 0x10) >> 4 & 0x7fff);
    sVar6 = sysbvm_orderedCollection_getSize(*(sysbvm_tuple_t *)(lVar1 + 0x20));
    if (uVar9 < sVar6) {
      psVar7 = (sysbvm_tuple_t *)
               sysbvm_orderedCollection_at(*(sysbvm_tuple_t *)(lVar1 + 0x20),uVar9);
      if (((ulong)psVar7 & 0xf) == 0 && psVar7 != (sysbvm_tuple_t *)0x0) {
        sVar8 = sysbvm_type_getFlags(*psVar7);
        if (((uint)sVar8 >> 0xc & 1) != 0) {
          sStack_a0 = psVar7[0xb];
          goto LAB_0013f8aa;
        }
      }
    }
  }
  sStack_a0 = 0;
LAB_0013f8aa:
  if (sStack_a0 == (context->roots).anyValueToVoidPrimitiveName) {
    for (sVar4 = 0; sVar10 != sVar4; sVar4 = sVar4 + 1) {
      uVar9 = *(ulong *)(*arguments + 0x30);
      if ((uVar9 & 0xf) == 0 && uVar9 != 0) {
        sStack_90 = *(sysbvm_tuple_t *)(uVar9 + 0x10 + sVar4 * 8);
      }
      else {
        sStack_90 = 0;
      }
      sysbvm_functionBytecodeDirectCompiler_compileASTNode
                (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],sStack_90);
    }
    sStack_80 = sysbvm_functionBytecodeAssembler_addLiteral
                          (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),
                           0x2f);
    psVar7 = &sStack_80;
  }
  else if ((sStack_a0 == (context->roots).pointerLikeLoadPrimitiveName) && ((int)sVar10 == 1)) {
    uVar9 = *(ulong *)(*arguments + 0x30);
    if ((uVar9 & 0xf) == 0 && uVar9 != 0) {
      sStack_90 = *(sysbvm_tuple_t *)(uVar9 + 0x10);
    }
    else {
      sStack_90 = 0;
    }
    psVar7 = &sStack_80;
    sStack_70 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                          (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],sStack_90
                          );
    sStack_80 = sysbvm_functionBytecodeAssembler_newTemporary
                          (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),
                           *(sysbvm_tuple_t *)(*arguments + 0x20));
    sysbvm_functionBytecodeAssembler_load
              (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),sStack_80,
               sStack_70);
  }
  else if ((sStack_a0 == (context->roots).pointerLikeStorePrimitiveName) && ((int)sVar10 == 2)) {
    uVar9 = *(ulong *)(*arguments + 0x30);
    if ((uVar9 & 0xf) == 0 && uVar9 != 0) {
      sStack_90 = *(sysbvm_tuple_t *)(uVar9 + 0x10);
    }
    else {
      sStack_90 = 0;
    }
    sStack_70 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                          (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],sStack_90
                          );
    uVar9 = *(ulong *)(*arguments + 0x30);
    if ((uVar9 & 0xf) == 0 && uVar9 != 0) {
      sStack_90 = *(sysbvm_tuple_t *)(uVar9 + 0x18);
    }
    else {
      sStack_90 = 0;
    }
    psVar7 = &sStack_70;
    local_68 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                         (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],sStack_90)
    ;
    sysbvm_functionBytecodeAssembler_store
              (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),sStack_70,
               local_68);
  }
  else {
    local_98 = sysbvm_array_create(context,sVar10);
    for (sVar4 = 0; sVar10 != sVar4; sVar4 = sVar4 + 1) {
      uVar9 = *(ulong *)(*arguments + 0x30);
      if ((uVar9 & 0xf) == 0 && uVar9 != 0) {
        sStack_90 = *(sysbvm_tuple_t *)(uVar9 + 0x10 + sVar4 * 8);
      }
      else {
        sStack_90 = 0;
      }
      local_88 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                           (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
                            sStack_90);
      if ((local_98 & 0xf) == 0 && local_98 != 0) {
        *(sysbvm_tuple_t *)(local_98 + 0x10 + sVar4 * 8) = local_88;
      }
    }
    sVar10 = *(sysbvm_tuple_t *)(*arguments + 0x20);
    _Var2 = sysbvm_type_isDirectSubtypeOf(sVar10,(context->roots).voidType);
    _Var3 = sysbvm_type_isDirectSubtypeOf(sVar10,(context->roots).controlFlowEscapeType);
    if (_Var2) {
      local_78 = 0;
      sStack_80 = sysbvm_functionBytecodeAssembler_addLiteral
                            (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),
                             0x2f);
    }
    else {
      sStack_80 = sysbvm_functionBytecodeAssembler_newTemporary
                            (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),
                             sVar10);
      local_78 = sStack_80;
    }
    uVar9 = *(ulong *)(*arguments + 0x38);
    if (uVar9 == 0 || (uVar9 & 0xf) != 0) {
      uVar9 = (long)uVar9 >> 4;
    }
    else {
      uVar9 = *(ulong *)(uVar9 + 0x10);
    }
    if ((uVar9 & 1) == 0) {
      sysbvm_functionBytecodeAssembler_call
                (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),local_78,
                 local_a8,local_98);
    }
    else {
      sysbvm_functionBytecodeAssembler_uncheckedCall
                (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),local_78,
                 local_a8,local_98);
    }
    psVar7 = &sStack_80;
    if (_Var3) {
      sysbvm_functionBytecodeAssembler_unreachable
                (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10));
    }
  }
  sysbvm_stackFrame_popRecord(&local_58);
  return *psVar7;
}

Assistant:

static sysbvm_tuple_t sysbvm_astFunctionApplicationNode_primitiveCompileIntoBytecode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_functionBytecodeDirectCompiler_t **compiler = (sysbvm_functionBytecodeDirectCompiler_t **)&arguments[1];

    sysbvm_astFunctionApplicationNode_t **applicationNode = (sysbvm_astFunctionApplicationNode_t**)node;
    struct {
        sysbvm_tuple_t function;
        sysbvm_tuple_t primitiveName;
        sysbvm_tuple_t arguments;
        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t argumentOperand;
        sysbvm_tuple_t result;
        sysbvm_tuple_t resultTemporary;

        sysbvm_tuple_t pointerOperand;
        sysbvm_tuple_t valueOperand;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    size_t applicationArgumentCount = sysbvm_array_getSize((*applicationNode)->arguments);

    gcFrame.function = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*applicationNode)->functionExpression);

    // Inline some special functions here.
    gcFrame.primitiveName = sysbvm_functionBytecodeAssembler_getLiteralFunctionPrimitiveName(context, (*compiler)->assembler, gcFrame.function);
    if(gcFrame.primitiveName == context->roots.anyValueToVoidPrimitiveName)
    {
        for(size_t i = 0; i < applicationArgumentCount; ++i)
        {
            gcFrame.argumentNode = sysbvm_array_at((*applicationNode)->arguments, i);
            sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, gcFrame.argumentNode);
        }

        gcFrame.result = sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, SYSBVM_VOID_TUPLE);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.result;
    }
    else if(gcFrame.primitiveName == context->roots.pointerLikeLoadPrimitiveName && applicationArgumentCount == 1)
    {
        gcFrame.argumentNode = sysbvm_array_at((*applicationNode)->arguments, 0);
        gcFrame.pointerOperand = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, gcFrame.argumentNode);

        gcFrame.result = sysbvm_functionBytecodeAssembler_newTemporary(context, (*compiler)->assembler, (*applicationNode)->super.analyzedType);
        sysbvm_functionBytecodeAssembler_load(context, (*compiler)->assembler, gcFrame.result, gcFrame.pointerOperand);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.result;
    }
    else if(gcFrame.primitiveName == context->roots.pointerLikeStorePrimitiveName && applicationArgumentCount == 2)
    {
        gcFrame.argumentNode = sysbvm_array_at((*applicationNode)->arguments, 0);
        gcFrame.pointerOperand = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, gcFrame.argumentNode);

        gcFrame.argumentNode = sysbvm_array_at((*applicationNode)->arguments, 1);
        gcFrame.valueOperand = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, gcFrame.argumentNode);

        sysbvm_functionBytecodeAssembler_store(context, (*compiler)->assembler, gcFrame.pointerOperand, gcFrame.valueOperand);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.pointerOperand;
    }

    gcFrame.arguments = sysbvm_array_create(context, applicationArgumentCount);

    for(size_t i = 0; i < applicationArgumentCount; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at((*applicationNode)->arguments, i);
        gcFrame.argumentOperand = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, gcFrame.argumentNode);
        sysbvm_array_atPut(gcFrame.arguments, i, gcFrame.argumentOperand);
    }

    bool isVoidType = sysbvm_type_isDirectSubtypeOf((*applicationNode)->super.analyzedType, context->roots.voidType);
    bool isControlFlowEscape = sysbvm_type_isDirectSubtypeOf((*applicationNode)->super.analyzedType, context->roots.controlFlowEscapeType);
    if(isVoidType)
    {
        gcFrame.resultTemporary = SYSBVM_NULL_TUPLE;
        gcFrame.result = sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, SYSBVM_VOID_TUPLE);
    }
    else
    {
        gcFrame.resultTemporary = sysbvm_functionBytecodeAssembler_newTemporary(context, (*compiler)->assembler, (*applicationNode)->super.analyzedType);
        gcFrame.result = gcFrame.resultTemporary;
    }

    sysbvm_bitflags_t applicationFlags = sysbvm_tuple_bitflags_decode((*applicationNode)->applicationFlags);
    bool isNotypecheck = (applicationFlags & SYSBVM_FUNCTION_APPLICATION_FLAGS_NO_TYPECHECK) != 0;

    if(isNotypecheck)
        sysbvm_functionBytecodeAssembler_uncheckedCall(context, (*compiler)->assembler, gcFrame.resultTemporary, gcFrame.function, gcFrame.arguments);
    else
        sysbvm_functionBytecodeAssembler_call(context, (*compiler)->assembler, gcFrame.resultTemporary, gcFrame.function, gcFrame.arguments);

    if(isControlFlowEscape)
        sysbvm_functionBytecodeAssembler_unreachable(context, (*compiler)->assembler);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}